

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestVC.cxx
# Opt level: O2

bool __thiscall
cmCTestVC::RunUpdateCommand
          (cmCTestVC *this,char **cmd,OutputParser *out,OutputParser *err,Encoding encoding)

{
  bool bVar1;
  ostream *poVar2;
  string local_50;
  
  ComputeCommandLine_abi_cxx11_(&local_50,(cmCTestVC *)cmd,(char **)out);
  std::__cxx11::string::operator=((string *)&this->UpdateCommandLine,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  bVar1 = cmCTest::GetShowOnly(this->CTest);
  if (bVar1) {
    poVar2 = std::operator<<(this->Log,(string *)&this->UpdateCommandLine);
    std::operator<<(poVar2,"\n");
    bVar1 = true;
  }
  else {
    bVar1 = RunChild(this,cmd,out,err,(char *)0x0,encoding);
  }
  return bVar1;
}

Assistant:

bool cmCTestVC::RunUpdateCommand(char const* const* cmd, OutputParser* out,
                                 OutputParser* err, Encoding encoding)
{
  // Report the command line.
  this->UpdateCommandLine = this->ComputeCommandLine(cmd);
  if (this->CTest->GetShowOnly()) {
    this->Log << this->UpdateCommandLine << "\n";
    return true;
  }

  // Run the command.
  return this->RunChild(cmd, out, err, nullptr, encoding);
}